

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::trySymlink
          (InMemoryDirectory *this,PathPtr path,StringPtr content,WriteMode mode)

{
  Impl *pIVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined1 uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar6;
  char *pcVar7;
  String *pSVar8;
  bool bVar9;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  undefined1 local_58 [16];
  size_t local_48;
  ArrayDisposer *local_40;
  Maybe<kj::_::Mutex::Waiter_&> local_38;
  
  sVar6 = path.parts.size_;
  pSVar8 = path.parts.ptr;
  if (sVar6 == 1) {
    local_38.ptr = (Waiter *)&this->impl;
    local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
    kj::_::Mutex::lock((Mutex *)local_38.ptr,0);
    pIVar1 = &(this->impl).value;
    sVar6 = (pSVar8->content).size_;
    if (sVar6 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pSVar8->content).ptr;
    }
    name.content.size_ = (size_t)pcVar7;
    name.content.ptr = (char *)pIVar1;
    Impl::openEntry((Impl *)local_58,name,(int)sVar6 + (uint)(sVar6 == 0));
    uVar3 = local_58._0_8_;
    bVar9 = (Exception *)local_58._0_8_ != (Exception *)0x0;
    if (bVar9) {
      iVar5 = (**pIVar1->clock->_vptr_Clock)();
      local_58._0_8_ = CONCAT44(extraout_var,iVar5);
      heapString((String *)(local_58 + 8),content.content.ptr,content.content.size_ - 1);
      if (*(int *)(uVar3 + 0x18) != 0) {
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                   *)(uVar3 + 0x18));
      }
      *(undefined8 *)(uVar3 + 0x20) = local_58._0_8_;
      (((String *)(uVar3 + 0x28))->content).ptr = (char *)local_58._8_8_;
      (((String *)(uVar3 + 0x28))->content).size_ = local_48;
      (((String *)(uVar3 + 0x28))->content).disposer = local_40;
      *(undefined4 *)(uVar3 + 0x18) = 3;
      iVar5 = (**pIVar1->clock->_vptr_Clock)();
      (this->impl).value.lastModified.value.value = CONCAT44(extraout_var_00,iVar5);
    }
    kj::_::Mutex::unlock((Mutex *)local_38.ptr,EXCLUSIVE,(Waiter *)0x0);
  }
  else {
    if (sVar6 == 0) {
      if ((mode & CREATE) != 0) {
        return false;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4de,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
    }
    else {
      sVar2 = (pSVar8->content).size_;
      if (sVar2 == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pSVar8->content).ptr;
      }
      name_00.content.size_ = (size_t)pcVar7;
      name_00.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)local_58,name_00,(int)sVar2 + (uint)(sVar2 == 0));
      if ((InMemoryFileFactory *)local_58._8_8_ != (InMemoryFileFactory *)0x0) {
        uVar4 = (**(code **)(*(_func_int **)local_58._8_8_ + 0x98))
                          (local_58._8_8_,pSVar8 + 1,sVar6 - 1,content.content.ptr,
                           content.content.size_,mode);
        (**(code **)(((String *)local_58._0_8_)->content).ptr)
                  (local_58._0_8_,
                   (InMemoryFileFactory *)
                   (local_58._8_8_ + *(long *)(*(_func_int **)local_58._8_8_ + -0x10)));
        return (bool)uVar4;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                ((Fault *)local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4ed,FAILED,(char *)0x0,"\"couldn\'t create parent directory\"",
                 (char (*) [33])"couldn\'t create parent directory");
    }
    bVar9 = false;
    kj::_::Debug::Fault::~Fault((Fault *)local_58);
  }
  return bVar9;
}

Assistant:

bool trySymlink(PathPtr path, StringPtr content, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(path[0], mode)) {
        entry.init(SymlinkNode { lock->clock.now(), heapString(content) });
        lock->modified();
        return true;
      } else {
        return false;
      }
    } else {
      KJ_IF_SOME(child, tryGetParent(path[0], mode)) {
        return child->trySymlink(path.slice(1, path.size()), content, mode);
      } else {
        KJ_FAIL_REQUIRE("couldn't create parent directory") { return false; }
      }